

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O2

void xmlCtxtDumpInitCtxt(xmlDebugCtxtPtr ctxt)

{
  long lVar1;
  
  ctxt->depth = 0;
  ctxt->output = _stdout;
  ctxt->check = 0;
  ctxt->errors = 0;
  ctxt->nodict = 0;
  ctxt->options = 0;
  ctxt->doc = (xmlDocPtr)0x0;
  ctxt->node = (xmlNodePtr)0x0;
  ctxt->dict = (xmlDictPtr)0x0;
  for (lVar1 = 8; lVar1 != 0x6c; lVar1 = lVar1 + 1) {
    ctxt->shift[lVar1 + -8] = ' ';
  }
  ctxt->shift[100] = '\0';
  return;
}

Assistant:

static void
xmlCtxtDumpInitCtxt(xmlDebugCtxtPtr ctxt)
{
    int i;

    ctxt->depth = 0;
    ctxt->check = 0;
    ctxt->errors = 0;
    ctxt->output = stdout;
    ctxt->doc = NULL;
    ctxt->node = NULL;
    ctxt->dict = NULL;
    ctxt->nodict = 0;
    ctxt->options = 0;
    for (i = 0; i < 100; i++)
        ctxt->shift[i] = ' ';
    ctxt->shift[100] = 0;
}